

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

ptls_hash_context_t * ptls_hmac_create(ptls_hash_algorithm_t *algo,void *key,size_t key_size)

{
  ptls_hash_algorithm_t *__dest;
  ptls_hash_context_t *ppVar1;
  code *local_60;
  code *local_58;
  undefined8 local_50;
  void *local_48;
  undefined8 local_40;
  undefined1 auStack_38 [8];
  ptls_hash_algorithm_t *local_30;
  st_picotls_hmac_context_t *ctx;
  size_t key_size_local;
  void *key_local;
  ptls_hash_algorithm_t *algo_local;
  
  ctx = (st_picotls_hmac_context_t *)key_size;
  key_size_local = (size_t)key;
  key_local = algo;
  if (key_size <= algo->block_size) {
    __dest = (ptls_hash_algorithm_t *)malloc(algo->block_size + 0x28);
    if (__dest == (ptls_hash_algorithm_t *)0x0) {
      algo_local = (ptls_hash_algorithm_t *)0x0;
    }
    else {
      local_60 = hmac_update;
      local_58 = hmac_final;
      local_50 = 0;
      local_48 = key_local;
      local_40 = 0;
      local_30 = __dest;
      memset(auStack_38,0,1);
      memcpy(__dest,&local_60,0x30);
      ppVar1 = (ptls_hash_context_t *)(**(code **)((long)key_local + 0x10))();
      *(ptls_hash_context_t **)((long)local_30->empty_digest + 8) = ppVar1;
      if (ppVar1 == (ptls_hash_context_t *)0x0) {
        free(local_30);
        algo_local = (ptls_hash_algorithm_t *)0x0;
      }
      else {
        memset((uint8_t *)((long)local_30->empty_digest + 0x10),0,*key_local);
        memcpy((uint8_t *)((long)local_30->empty_digest + 0x10),(void *)key_size_local,(size_t)ctx);
        hmac_apply_key((st_picotls_hmac_context_t *)local_30,'6');
        algo_local = local_30;
      }
    }
    return (ptls_hash_context_t *)algo_local;
  }
  __assert_fail("key_size <= algo->block_size",
                "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/lib/picotls.c",
                0x1317,
                "ptls_hash_context_t *ptls_hmac_create(ptls_hash_algorithm_t *, const void *, size_t)"
               );
}

Assistant:

ptls_hash_context_t *ptls_hmac_create(ptls_hash_algorithm_t *algo, const void *key, size_t key_size)
{
    struct st_picotls_hmac_context_t *ctx;

    assert(key_size <= algo->block_size);

    if ((ctx = malloc(offsetof(struct st_picotls_hmac_context_t, key) + algo->block_size)) == NULL)
        return NULL;

    *ctx = (struct st_picotls_hmac_context_t){{hmac_update, hmac_final}, algo};
    if ((ctx->hash = algo->create()) == NULL) {
        free(ctx);
        return NULL;
    }
    memset(ctx->key, 0, algo->block_size);
    memcpy(ctx->key, key, key_size);

    hmac_apply_key(ctx, 0x36);

    return &ctx->super;
}